

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Material::destroy(Material *this)

{
  Material *this_local;
  
  this->refCount = this->refCount + -1;
  if (this->refCount < 1) {
    PluginList::destruct((PluginList *)&s_plglist,this);
    if (this->texture != (Texture *)0x0) {
      Texture::destroy(this->texture);
    }
    (*DAT_001685f8)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Material::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		if(this->texture)
			this->texture->destroy();
		rwFree(this);
		numAllocated--;
	}
}